

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O2

int ARKodeSetRelaxMaxIters(void *arkode_mem,int max_iters)

{
  int iVar1;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkRelaxAccessMem(arkode_mem,"ARKodeSetRelaxMaxIters",&ark_mem,&relax_mem);
  if (iVar1 == 0) {
    if (ark_mem->step_supports_relaxation == 0) {
      iVar1 = -0x30;
      arkProcessError(ark_mem,-0x30,0x20a,"ARKodeSetRelaxMaxIters",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
    }
    else {
      if (max_iters < 1) {
        relax_mem->max_iters = 10;
      }
      else {
        relax_mem->max_iters = max_iters;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetRelaxMaxIters(void* arkode_mem, int max_iters)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (max_iters > 0) { relax_mem->max_iters = max_iters; }
  else { relax_mem->max_iters = ARK_RELAX_DEFAULT_MAX_ITERS; }

  return ARK_SUCCESS;
}